

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_string.cpp
# Opt level: O2

void __thiscall
JsonString_GCleffUtf8_Test::JsonString_GCleffUtf8_Test(JsonString_GCleffUtf8_Test *this)

{
  anon_unknown.dwarf_1a1265::JsonString::JsonString(&this->super_JsonString);
  (this->super_JsonString).super_Test._vptr_Test = (_func_int **)&PTR__JsonString_001ad140;
  return;
}

Assistant:

TEST_F (JsonString, GCleffUtf8) {
    // Encoding for MUSICAL SYMBOL G CLEF (U+1D11E) expressed in UTF-8
    // Note that the 4 bytes making up the code point count as a single column.
    EXPECT_CALL (callbacks_, string_value ("\xF0\x9D\x84\x9E")).Times (1);

    auto p = json::make_parser (proxy_);
    p.input ("\"\xF0\x9D\x84\x9E\""s).eof ();
    EXPECT_FALSE (p.has_error ()) << "Expected the parse to succeed";
    EXPECT_FALSE (p.last_error ()) << "Expected the parse error to be zero";
    EXPECT_EQ (p.coordinate (), (json::coord{4U, 1U}));
}